

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  GLFWwindow *pGVar3;
  int local_68;
  int local_64;
  int bottom;
  int right;
  int top;
  int left;
  GLFWwindow *windows [4];
  int local_28;
  int running;
  int focusOnShow;
  int decorated;
  int ch;
  int i;
  char **argv_local;
  int argc_local;
  
  running = 0;
  local_28 = 1;
  bVar1 = true;
  while( true ) {
    while( true ) {
      iVar2 = getopt(argc,argv,"bfh");
      if (iVar2 == -1) {
        glfwSetErrorCallback(error_callback);
        iVar2 = glfwInit();
        if (iVar2 == 0) {
          exit(1);
        }
        glfwWindowHint(0x20005,running);
        glfwWindowHint(0x20004,0);
        decorated = 0;
        while( true ) {
          if (3 < decorated) {
            for (decorated = 0; decorated < 4; decorated = decorated + 1) {
              glfwShowWindow(*(GLFWwindow **)(&top + (long)decorated * 2));
            }
            while (bVar1) {
              for (decorated = 0; decorated < 4; decorated = decorated + 1) {
                glfwMakeContextCurrent(*(GLFWwindow **)(&top + (long)decorated * 2));
                (*glad_glClear)(0x4000);
                glfwSwapBuffers(*(GLFWwindow **)(&top + (long)decorated * 2));
                iVar2 = glfwWindowShouldClose(*(GLFWwindow **)(&top + (long)decorated * 2));
                if (iVar2 != 0) {
                  bVar1 = false;
                }
              }
              glfwWaitEvents();
            }
            glfwTerminate();
            exit(0);
          }
          if (decorated != 0) {
            glfwWindowHint(0x2000c,local_28);
          }
          pGVar3 = glfwCreateWindow(200,200,titles[decorated],(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
          *(GLFWwindow **)(&top + (long)decorated * 2) = pGVar3;
          if (*(long *)(&top + (long)decorated * 2) == 0) break;
          glfwSetKeyCallback(*(GLFWwindow **)(&top + (long)decorated * 2),key_callback);
          glfwMakeContextCurrent(*(GLFWwindow **)(&top + (long)decorated * 2));
          gladLoadGL(glfwGetProcAddress);
          (*glad_glClearColor)(colors[decorated].r,colors[decorated].g,colors[decorated].b,1.0);
          glfwGetWindowFrameSize
                    (*(GLFWwindow **)(&top + (long)decorated * 2),&right,&bottom,&local_64,&local_68
                    );
          glfwSetWindowPos(*(GLFWwindow **)(&top + (long)decorated * 2),
                           (decorated & 1U) * (right + 200 + local_64) + 100,
                           (decorated >> 1) * (bottom + 200 + local_68) + 100);
          decorated = decorated + 1;
        }
        glfwTerminate();
        exit(1);
      }
      if (iVar2 != 0x62) break;
      running = 1;
    }
    if (iVar2 != 0x66) break;
    local_28 = 0;
  }
  if (iVar2 == 0x68) {
    usage();
    exit(0);
  }
  usage();
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int i, ch;
    int decorated = GLFW_FALSE;
    int focusOnShow = GLFW_TRUE;
    int running = GLFW_TRUE;
    GLFWwindow* windows[4];

    while ((ch = getopt(argc, argv, "bfh")) != -1)
    {
        switch (ch)
        {
            case 'b':
                decorated = GLFW_TRUE;
                break;
            case 'f':
                focusOnShow = GLFW_FALSE;
                break;
            case 'h':
                usage();
                exit(EXIT_SUCCESS);
            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_DECORATED, decorated);
    glfwWindowHint(GLFW_VISIBLE, GLFW_FALSE);

    for (i = 0;  i < 4;  i++)
    {
        int left, top, right, bottom;
        if (i)
            glfwWindowHint(GLFW_FOCUS_ON_SHOW, focusOnShow);

        windows[i] = glfwCreateWindow(200, 200, titles[i], NULL, NULL);
        if (!windows[i])
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glfwSetKeyCallback(windows[i], key_callback);

        glfwMakeContextCurrent(windows[i]);
        gladLoadGL(glfwGetProcAddress);
        glClearColor(colors[i].r, colors[i].g, colors[i].b, 1.f);

        glfwGetWindowFrameSize(windows[i], &left, &top, &right, &bottom);
        glfwSetWindowPos(windows[i],
                         100 + (i & 1) * (200 + left + right),
                         100 + (i >> 1) * (200 + top + bottom));
    }

    for (i = 0;  i < 4;  i++)
        glfwShowWindow(windows[i]);

    while (running)
    {
        for (i = 0;  i < 4;  i++)
        {
            glfwMakeContextCurrent(windows[i]);
            glClear(GL_COLOR_BUFFER_BIT);
            glfwSwapBuffers(windows[i]);

            if (glfwWindowShouldClose(windows[i]))
                running = GLFW_FALSE;
        }

        glfwWaitEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}